

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

void filemgr_remove_file(filemgr *file,err_log_callback *log_callback)

{
  hash_elem *phVar1;
  filemgr *pfVar2;
  
  if ((file == (filemgr *)0x0) || ((file->ref_count).super___atomic_base<unsigned_int>._M_i != 0)) {
    return;
  }
  pthread_spin_lock(&filemgr_openlock);
  phVar1 = hash_remove(&hash,&file->e);
  if (phVar1 == (hash_elem *)0x0) {
    fdb_assert_die("ret",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,0x6cd,0,0);
  }
  pthread_spin_unlock(&filemgr_openlock);
  pfVar2 = filemgr_get_instance(file->new_filename);
  if ((lazy_file_deletion_enabled == true) &&
     ((pfVar2 == (filemgr *)0x0 || (pfVar2->in_place_compaction != true)))) {
    (*register_file_removal)(file,log_callback);
    return;
  }
  filemgr_free_func(&file->e);
  return;
}

Assistant:

void filemgr_remove_file(struct filemgr *file, err_log_callback *log_callback)
{
    struct hash_elem *ret;

    if (!file || atomic_get_uint32_t(&file->ref_count) > 0) {
        return;
    }

    // remove from global hash table
    spin_lock(&filemgr_openlock);
    ret = hash_remove(&hash, &file->e);
    fdb_assert(ret, ret, NULL);
    spin_unlock(&filemgr_openlock);

    struct filemgr *new_file = filemgr_get_instance(file->new_filename);

    if (!lazy_file_deletion_enabled ||
        (new_file && new_file->in_place_compaction)) {
        filemgr_free_func(&file->e);
    } else {
        register_file_removal(file, log_callback);
    }
}